

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTaggerValidator.cpp
# Opt level: O0

Result_conflict *
CoreML::validate<(MLModelType)2001>(Result_conflict *__return_storage_ptr__,Model *format)

{
  allocator<CoreML::Specification::FeatureType::TypeCase> *this;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  this_00;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  TypeCase TVar5;
  uint32 uVar6;
  TagsCase TVar7;
  long lVar8;
  FeatureDescription *pFVar9;
  string *psVar10;
  FeatureType *pFVar11;
  ostream *poVar12;
  char *pcVar13;
  StringVector *this_02;
  ulong uVar14;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_9e9;
  string local_9e8;
  string local_9c0;
  int numTags;
  undefined1 local_978 [64];
  stringstream local_938 [8];
  stringstream out_3;
  ostream local_928 [376];
  SequenceFeatureType *local_7b0;
  SequenceFeatureType *tokenLengthsOutputSequenceType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  stringstream local_768 [8];
  stringstream out_2;
  ostream local_758 [376];
  SequenceFeatureType *local_5e0;
  SequenceFeatureType *tokenLocationsOutputSequenceType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  stringstream local_598 [8];
  stringstream out_1;
  ostream local_588 [376];
  SequenceFeatureType *local_410;
  SequenceFeatureType *tokensOutputSequenceType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  stringstream local_3c8 [8];
  stringstream out;
  ostream local_3b8 [376];
  SequenceFeatureType *local_240;
  SequenceFeatureType *tokenTagsOutputSequenceType;
  iterator local_230;
  size_type local_228;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_220;
  Result local_208;
  uchar *local_1d8;
  size_type local_1d0;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_1c8;
  undefined1 local_1b0 [48];
  Result_conflict result;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  undefined1 local_d0 [7];
  bool present;
  int local_b0;
  int local_ac;
  int i;
  int tokenLengthsOutputIndex;
  int tokenLocationsOutputIndex;
  int tokenTagsOutputIndex;
  int tokensOutputIndex;
  int local_74;
  WordTagger *pWStack_70;
  int numNonEmptyOutputFeatures;
  WordTagger *wordTagger;
  allocator local_51;
  string local_50;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *outputs;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *inputs;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  inputs = (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
           Specification::Model::description(format);
  outputs = Specification::ModelDescription::input((ModelDescription *)inputs);
  local_50._M_storage._M_storage =
       (uchar  [8])Specification::ModelDescription::output((ModelDescription *)inputs);
  bVar1 = Specification::Model::has_wordtagger((Model *)interface);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Model not a word tagger.",&local_51);
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    return __return_storage_ptr__;
  }
  pWStack_70 = Specification::Model::wordtagger((Model *)interface);
  local_74 = 0;
  Specification::CoreMLModels::WordTagger::tokentagsoutputfeaturename_abi_cxx11_(pWStack_70);
  lVar8 = std::__cxx11::string::length();
  if (lVar8 != 0) {
    local_74 = local_74 + 1;
  }
  Specification::CoreMLModels::WordTagger::tokensoutputfeaturename_abi_cxx11_(pWStack_70);
  lVar8 = std::__cxx11::string::length();
  if (lVar8 != 0) {
    local_74 = local_74 + 1;
  }
  Specification::CoreMLModels::WordTagger::tokenlocationsoutputfeaturename_abi_cxx11_(pWStack_70);
  lVar8 = std::__cxx11::string::length();
  if (lVar8 != 0) {
    local_74 = local_74 + 1;
  }
  Specification::CoreMLModels::WordTagger::tokenlengthsoutputfeaturename_abi_cxx11_(pWStack_70);
  lVar8 = std::__cxx11::string::length();
  if (lVar8 != 0) {
    local_74 = local_74 + 1;
  }
  iVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                    ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                     local_50._M_storage._M_storage);
  if (iVar2 != local_74) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&tokensOutputIndex,
               "More model output features than the output features of the word tagger model.",
               (allocator *)((long)&tokenTagsOutputIndex + 3));
    Result::Result((Result *)__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                   (string *)&tokensOutputIndex);
    std::__cxx11::string::~string((string *)&tokensOutputIndex);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tokenTagsOutputIndex + 3));
    return __return_storage_ptr__;
  }
  tokenLocationsOutputIndex = -1;
  tokenLengthsOutputIndex = -1;
  i = -1;
  local_ac = -1;
  for (local_b0 = 0; iVar2 = local_b0,
      iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                        ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                         local_50._M_storage._M_storage), iVar2 < iVar3; local_b0 = local_b0 + 1) {
    pFVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                        local_50._M_storage._M_storage,local_b0);
    psVar10 = Specification::FeatureDescription::name_abi_cxx11_(pFVar9);
    std::__cxx11::string::string((string *)local_d0,(string *)psVar10);
    local_f8._M_storage._M_storage[7] = 0;
    psVar10 = Specification::CoreMLModels::WordTagger::tokensoutputfeaturename_abi_cxx11_
                        (pWStack_70);
    iVar2 = std::__cxx11::string::compare((string *)psVar10);
    if (iVar2 == 0) {
      tokenLocationsOutputIndex = local_b0;
      local_f8._M_storage._M_storage[7] = 1;
    }
    psVar10 = Specification::CoreMLModels::WordTagger::tokentagsoutputfeaturename_abi_cxx11_
                        (pWStack_70);
    iVar2 = std::__cxx11::string::compare((string *)psVar10);
    if (iVar2 == 0) {
      tokenLengthsOutputIndex = local_b0;
      local_f8._M_storage._M_storage[7] = 1;
    }
    psVar10 = Specification::CoreMLModels::WordTagger::tokenlocationsoutputfeaturename_abi_cxx11_
                        (pWStack_70);
    iVar2 = std::__cxx11::string::compare((string *)psVar10);
    if (iVar2 == 0) {
      i = local_b0;
      local_f8._M_storage._M_storage[7] = 1;
    }
    psVar10 = Specification::CoreMLModels::WordTagger::tokenlengthsoutputfeaturename_abi_cxx11_
                        (pWStack_70);
    iVar2 = std::__cxx11::string::compare((string *)psVar10);
    if (iVar2 == 0) {
      local_ac = local_b0;
      local_f8._M_storage._M_storage[7] = 1;
    }
    bVar1 = (local_f8._M_storage._M_storage[7] & 1) == 0;
    if (bVar1) {
      std::operator+(&local_118,"Output feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                     &local_118,
                     "\' was not required by the output features of the word tagger model.");
      Result::Result((Result *)__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    local_140._M_storage._M_storage._5_3_ = 0;
    local_140._M_storage._M_storage[4] = bVar1;
    std::__cxx11::string::~string((string *)local_d0);
    if (local_140._M_storage._M_storage._4_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  if (tokenLengthsOutputIndex == -1) {
    psVar10 = Specification::CoreMLModels::WordTagger::tokentagsoutputfeaturename_abi_cxx11_
                        (pWStack_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &result.field_0x20,"Expected feature \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &result.field_0x20,
                   "\' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description."
                  );
    Result::Result((Result *)__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&result.field_0x20);
    return __return_storage_ptr__;
  }
  Result::Result((Result *)(local_1b0 + 0x28));
  this_01 = outputs;
  local_208.m_message._M_storage._M_storage[4] = '\x03';
  local_208.m_message._M_storage._M_storage[5] = '\0';
  local_208.m_message._M_storage._M_storage[6] = '\0';
  local_208.m_message._M_storage._M_storage[7] = '\0';
  local_1d8 = local_208.m_message._M_storage._M_storage + 4;
  local_1d0 = 1;
  this = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
         (local_208.m_message._M_storage._M_storage + 3);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(this);
  __l_00._M_len = local_1d0;
  __l_00._M_array = (iterator)local_1d8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_1c8,__l_00,this);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_1b0,(CoreML *)this_01,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_1c8,
             in_R8);
  Result::operator=((Result *)(local_1b0 + 0x28),(Result *)local_1b0);
  Result::~Result((Result *)local_1b0);
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector(&local_1c8);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
             (local_208.m_message._M_storage._M_storage + 3));
  bVar1 = Result::good((Result *)(local_1b0 + 0x28));
  this_00._M_storage = local_50._M_storage._M_storage;
  if (bVar1) {
    uVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                       local_50._M_storage._M_storage);
    tokenTagsOutputSequenceType._4_4_ = 7;
    local_230 = (iterator)((long)&tokenTagsOutputSequenceType + 4);
    local_228 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
              ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
               ((long)&tokenTagsOutputSequenceType + 3));
    __l._M_len = local_228;
    __l._M_array = local_230;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_220,__l,
             (allocator<CoreML::Specification::FeatureType::TypeCase> *)
             ((long)&tokenTagsOutputSequenceType + 3));
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_208,(CoreML *)this_00._M_storage,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(ulong)uVar4,
               (int)&local_220,in_R8);
    Result::operator=((Result *)(local_1b0 + 0x28),&local_208);
    Result::~Result(&local_208);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_220);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
              ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
               ((long)&tokenTagsOutputSequenceType + 3));
    bVar1 = Result::good((Result *)(local_1b0 + 0x28));
    if (bVar1) {
      pFVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
               operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                          local_50._M_storage._M_storage,tokenLengthsOutputIndex);
      pFVar11 = Specification::FeatureDescription::type(pFVar9);
      local_240 = Specification::FeatureType::sequencetype(pFVar11);
      TVar5 = Specification::SequenceFeatureType::Type_case(local_240);
      if (TVar5 == kStringType) {
        if (tokenLocationsOutputIndex != -1) {
          pFVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                   operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                              local_50._M_storage._M_storage,tokenLocationsOutputIndex);
          pFVar11 = Specification::FeatureDescription::type(pFVar9);
          local_410 = Specification::FeatureType::sequencetype(pFVar11);
          TVar5 = Specification::SequenceFeatureType::Type_case(local_410);
          if (TVar5 != kStringType) {
            std::__cxx11::stringstream::stringstream(local_598);
            poVar12 = std::operator<<(local_588,"Unsupported type \"");
            TVar5 = Specification::SequenceFeatureType::Type_case(local_410);
            pcVar13 = ::MLFeatureTypeType_Name(TVar5);
            poVar12 = std::operator<<(poVar12,pcVar13);
            poVar12 = std::operator<<(poVar12,"\" for feature \"");
            psVar10 = Specification::CoreMLModels::WordTagger::tokensoutputfeaturename_abi_cxx11_
                                (pWStack_70);
            std::operator+(&local_5b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar10,"\". Should be: ");
            poVar12 = std::operator<<(poVar12,(string *)&local_5b8);
            pcVar13 = ::MLFeatureTypeType_Name(MLFeatureTypeType_stringType);
            std::operator<<(poVar12,pcVar13);
            std::__cxx11::string::~string((string *)&local_5b8);
            std::__cxx11::stringstream::str();
            Result::Result((Result *)__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,
                           (string *)&tokenLocationsOutputSequenceType);
            std::__cxx11::string::~string((string *)&tokenLocationsOutputSequenceType);
            local_140._M_storage._M_storage[4] = '\x01';
            local_140._M_storage._M_storage[5] = '\0';
            local_140._M_storage._M_storage[6] = '\0';
            local_140._M_storage._M_storage[7] = '\0';
            std::__cxx11::stringstream::~stringstream(local_598);
            goto LAB_003b016c;
          }
        }
        if (i != -1) {
          pFVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                   operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                              local_50._M_storage._M_storage,i);
          pFVar11 = Specification::FeatureDescription::type(pFVar9);
          local_5e0 = Specification::FeatureType::sequencetype(pFVar11);
          TVar5 = Specification::SequenceFeatureType::Type_case(local_5e0);
          if (TVar5 != kInt64Type) {
            std::__cxx11::stringstream::stringstream(local_768);
            poVar12 = std::operator<<(local_758,"Unsupported type \"");
            TVar5 = Specification::SequenceFeatureType::Type_case(local_5e0);
            pcVar13 = ::MLFeatureTypeType_Name(TVar5);
            poVar12 = std::operator<<(poVar12,pcVar13);
            poVar12 = std::operator<<(poVar12,"\" for feature \"");
            psVar10 = Specification::CoreMLModels::WordTagger::
                      tokenlocationsoutputfeaturename_abi_cxx11_(pWStack_70);
            std::operator+(&local_788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar10,"\". Should be: ");
            poVar12 = std::operator<<(poVar12,(string *)&local_788);
            pcVar13 = ::MLFeatureTypeType_Name(MLFeatureTypeType_int64Type);
            std::operator<<(poVar12,pcVar13);
            std::__cxx11::string::~string((string *)&local_788);
            std::__cxx11::stringstream::str();
            Result::Result((Result *)__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,
                           (string *)&tokenLengthsOutputSequenceType);
            std::__cxx11::string::~string((string *)&tokenLengthsOutputSequenceType);
            local_140._M_storage._M_storage[4] = '\x01';
            local_140._M_storage._M_storage[5] = '\0';
            local_140._M_storage._M_storage[6] = '\0';
            local_140._M_storage._M_storage[7] = '\0';
            std::__cxx11::stringstream::~stringstream(local_768);
            goto LAB_003b016c;
          }
        }
        if (local_ac != -1) {
          pFVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                   operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                              local_50._M_storage._M_storage,local_ac);
          pFVar11 = Specification::FeatureDescription::type(pFVar9);
          local_7b0 = Specification::FeatureType::sequencetype(pFVar11);
          TVar5 = Specification::SequenceFeatureType::Type_case(local_7b0);
          if (TVar5 != kInt64Type) {
            std::__cxx11::stringstream::stringstream(local_938);
            poVar12 = std::operator<<(local_928,"Unsupported type \"");
            TVar5 = Specification::SequenceFeatureType::Type_case(local_7b0);
            pcVar13 = ::MLFeatureTypeType_Name(TVar5);
            poVar12 = std::operator<<(poVar12,pcVar13);
            poVar12 = std::operator<<(poVar12,"\" for feature \"");
            psVar10 = Specification::CoreMLModels::WordTagger::
                      tokenlengthsoutputfeaturename_abi_cxx11_(pWStack_70);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_978 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar10,"\". Should be: ");
            poVar12 = std::operator<<(poVar12,(string *)(local_978 + 0x20));
            pcVar13 = ::MLFeatureTypeType_Name(MLFeatureTypeType_int64Type);
            std::operator<<(poVar12,pcVar13);
            std::__cxx11::string::~string((string *)(local_978 + 0x20));
            std::__cxx11::stringstream::str();
            Result::Result((Result *)__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,
                           (string *)local_978);
            std::__cxx11::string::~string((string *)local_978);
            local_140._M_storage._M_storage[4] = '\x01';
            local_140._M_storage._M_storage[5] = '\0';
            local_140._M_storage._M_storage[6] = '\0';
            local_140._M_storage._M_storage[7] = '\0';
            std::__cxx11::stringstream::~stringstream(local_938);
            goto LAB_003b016c;
          }
        }
        uVar6 = Specification::CoreMLModels::WordTagger::revision(pWStack_70);
        if (uVar6 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&numTags,"Model revision number not set. Must be >= 1",
                     (allocator *)(local_9c0._M_storage._M_storage + 7));
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                         (string *)&numTags);
          std::__cxx11::string::~string((string *)&numTags);
          std::allocator<char>::~allocator((allocator<char> *)(local_9c0._M_storage._M_storage + 7))
          ;
          local_140._M_storage._M_storage[4] = '\x01';
          local_140._M_storage._M_storage[5] = '\0';
          local_140._M_storage._M_storage[6] = '\0';
          local_140._M_storage._M_storage[7] = '\0';
        }
        else {
          TVar7 = Specification::CoreMLModels::WordTagger::Tags_case(pWStack_70);
          if (TVar7 == TAGS_NOT_SET) {
            local_9c0._M_storage._M_storage[0] = 0xff;
            local_9c0._M_storage._M_storage[1] = 0xff;
            local_9c0._M_storage._M_storage[2] = 0xff;
            local_9c0._M_storage._M_storage[3] = 0xff;
          }
          else if (TVar7 == kStringTags) {
            this_02 = Specification::CoreMLModels::WordTagger::stringtags(pWStack_70);
            local_9c0._M_storage._M_storage._0_4_ =
                 Specification::StringVector::vector_size(this_02);
          }
          if ((int)local_9c0._M_storage._M_storage._0_4_ < 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_9c0,"Model output tags not set. Must have at least one tag",
                       (allocator *)(local_9e8._M_storage._M_storage + 7));
            Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_9c0);
            std::__cxx11::string::~string((string *)&local_9c0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(local_9e8._M_storage._M_storage + 7));
            local_140._M_storage._M_storage[4] = '\x01';
            local_140._M_storage._M_storage[5] = '\0';
            local_140._M_storage._M_storage[6] = '\0';
            local_140._M_storage._M_storage[7] = '\0';
          }
          else {
            Specification::CoreMLModels::WordTagger::modelparameterdata_abi_cxx11_(pWStack_70);
            uVar14 = std::__cxx11::string::empty();
            if ((uVar14 & 1) == 0) {
              Result::Result((Result *)__return_storage_ptr__,(Result *)(local_1b0 + 0x28));
              local_140._M_storage._M_storage[4] = '\x01';
              local_140._M_storage._M_storage[5] = '\0';
              local_140._M_storage._M_storage[6] = '\0';
              local_140._M_storage._M_storage[7] = '\0';
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_9e8,"Model parameter data not set",&local_9e9);
              Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_9e8);
              std::__cxx11::string::~string((string *)&local_9e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
              local_140._M_storage._M_storage[4] = '\x01';
              local_140._M_storage._M_storage[5] = '\0';
              local_140._M_storage._M_storage[6] = '\0';
              local_140._M_storage._M_storage[7] = '\0';
            }
          }
        }
      }
      else {
        std::__cxx11::stringstream::stringstream(local_3c8);
        poVar12 = std::operator<<(local_3b8,"Unsupported type \"");
        TVar5 = Specification::SequenceFeatureType::Type_case(local_240);
        pcVar13 = ::MLFeatureTypeType_Name(TVar5);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" for feature \"");
        psVar10 = Specification::CoreMLModels::WordTagger::tokentagsoutputfeaturename_abi_cxx11_
                            (pWStack_70);
        std::operator+(&local_3e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10,
                       "\". Should be: ");
        poVar12 = std::operator<<(poVar12,(string *)&local_3e8);
        pcVar13 = ::MLFeatureTypeType_Name(MLFeatureTypeType_stringType);
        std::operator<<(poVar12,pcVar13);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::stringstream::str();
        Result::Result((Result *)__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,
                       (string *)&tokensOutputSequenceType);
        std::__cxx11::string::~string((string *)&tokensOutputSequenceType);
        local_140._M_storage._M_storage[4] = '\x01';
        local_140._M_storage._M_storage[5] = '\0';
        local_140._M_storage._M_storage[6] = '\0';
        local_140._M_storage._M_storage[7] = '\0';
        std::__cxx11::stringstream::~stringstream(local_3c8);
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_1b0 + 0x28));
      local_140._M_storage._M_storage[4] = '\x01';
      local_140._M_storage._M_storage[5] = '\0';
      local_140._M_storage._M_storage[6] = '\0';
      local_140._M_storage._M_storage[7] = '\0';
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_1b0 + 0x28));
    local_140._M_storage._M_storage[4] = '\x01';
    local_140._M_storage._M_storage[5] = '\0';
    local_140._M_storage._M_storage[6] = '\0';
    local_140._M_storage._M_storage[7] = '\0';
  }
LAB_003b016c:
  Result::~Result((Result *)(local_1b0 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordTagger>(const Specification::Model& format) {
        const auto& interface = format.description();
        const auto& inputs = interface.input();
        const auto& outputs = interface.output();
        
        // make sure model is a word tager
        if (!format.has_wordtagger()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word tagger.");
        }
        
        const auto& wordTagger = format.wordtagger();
        
        int numNonEmptyOutputFeatures = 0;
        
        if (wordTagger.tokentagsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokensoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlocationsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlengthsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (outputs.size() != numNonEmptyOutputFeatures) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                          "More model output features than the output features of the word tagger model.");
        }        
        
        int tokensOutputIndex = -1;
        int tokenTagsOutputIndex = -1;
        int tokenLocationsOutputIndex = -1;
        int tokenLengthsOutputIndex = -1;
        
        // check that any interface output can be found from word tagger outputs
        for (int i = 0; i < outputs.size(); i++) {
            const std::string name = outputs[i].name();
            bool present = false;
            
            if (wordTagger.tokensoutputfeaturename().compare(name) == 0) {
                tokensOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokentagsoutputfeaturename().compare(name) == 0) {
                tokenTagsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlocationsoutputfeaturename().compare(name) == 0) {
                tokenLocationsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlengthsoutputfeaturename().compare(name) == 0) {
                tokenLengthsOutputIndex = i;
                present = true;
            }
            
            if (!present) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not required by the output features of the word tagger model.");
            }
        }
        
        // token tags is the required output feature name, while tokens/locations/lengths are optional
        if (tokenTagsOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + wordTagger.tokentagsoutputfeaturename() + "' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(inputs, 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only sequence type is allowed for any output
        result = validateDescriptionsContainFeatureWithTypes(outputs, outputs.size(), {Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // validate the individual output type, token tags has to be a sequence of strings
        const auto& tokenTagsOutputSequenceType = outputs[tokenTagsOutputIndex].type().sequencetype();
        if (tokenTagsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenTagsOutputSequenceType.Type_case()))
            << "\" for feature \"" << wordTagger.tokentagsoutputfeaturename() + "\". Should be: "
            << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
            
            return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
        }

        // validate the individual output type, tokens (if present) has to be a sequence of strings
        if (tokensOutputIndex != -1) {
            const auto& tokensOutputSequenceType = outputs[tokensOutputIndex].type().sequencetype();
            if (tokensOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokensOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokensoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token locations (if present) has to be a sequence of integers
        if (tokenLocationsOutputIndex != -1) {
            const auto& tokenLocationsOutputSequenceType = outputs[tokenLocationsOutputIndex].type().sequencetype();
            if (tokenLocationsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLocationsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlocationsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token lengths (if present) has to be a sequence of integers
        if (tokenLengthsOutputIndex != -1) {
            const auto& tokenLengthsOutputSequenceType = outputs[tokenLengthsOutputIndex].type().sequencetype();
            if (tokenLengthsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLengthsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlengthsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // Validate the model parameters
        if (wordTagger.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }

        int numTags;
        switch (wordTagger.Tags_case()) {
            case Specification::CoreMLModels::WordTagger::kStringTags:
                numTags = wordTagger.stringtags().vector_size();
                break;
            case Specification::CoreMLModels::WordTagger::TAGS_NOT_SET:
                numTags = -1;
                break;
        }
        
        if (numTags <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output tags not set. Must have at least one tag");
        }
        
        if (wordTagger.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }